

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O0

self * __thiscall
boost::python::
class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
::add_property<long_timestamp_t::*>
          (class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
           *this,char *name,offset_in_timestamp_t_to_long fget,char *docstr)

{
  char *in_RCX;
  char *in_RSI;
  class_base *in_RDI;
  object *f;
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_stack_ffffffffffffffc8;
  object local_28;
  char *local_20;
  
  f = &local_28;
  local_20 = in_RCX;
  make_getter<long_timestamp_t::*>(in_stack_ffffffffffffffc8,(offset_in_timestamp_t_to_long)f);
  objects::class_base::add_property(in_RDI,in_RSI,f,local_20);
  api::object::~object((object *)0x390595);
  return (self *)in_RDI;
}

Assistant:

self& add_property(char const* name, Get fget, char const* docstr = 0)
    {
        base::add_property(name, this->make_getter(fget), docstr);
        return *this;
    }